

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O2

offset_t __thiscall lattice::supercell::lcord2offset(supercell *this,size_t lc)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong uVar5;
  size_t m;
  ulong uVar6;
  ulong uVar7;
  offset_t oVar8;
  
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<long,__1,_1,_0,__1,_1> *)this,(unsigned_long *)lc);
  lVar1 = *(long *)(lc + 0x40);
  lVar2 = *(long *)(lc + 0x50);
  sVar3 = this->dim_;
  uVar5 = extraout_RDX;
  for (uVar6 = 0; uVar6 < *(ulong *)lc; uVar6 = uVar6 + 1) {
    lVar4 = *(long *)(lVar1 + uVar6 * 8);
    *(ulong *)(sVar3 + uVar6 * 8) = in_RDX % (ulong)(*(long *)(lVar2 + uVar6 * 8) - lVar4) + lVar4;
    uVar7 = *(long *)(lVar2 + uVar6 * 8) - *(long *)(lVar1 + uVar6 * 8);
    uVar5 = in_RDX % uVar7;
    in_RDX = in_RDX / uVar7;
  }
  oVar8.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar5;
  oVar8.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data = (long *)this
  ;
  return (offset_t)oVar8.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

offset_t lcord2offset(std::size_t lc) const {
    offset_t c(dim_);
    for (std::size_t m = 0; m < dim_; ++m) {
      c(m) = (lc % (nmax_(m) - nmin_(m))) + nmin_(m);
      lc /= (nmax_(m) - nmin_(m));
    }
    return c;
  }